

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O2

void sftp_finish_wildcard_matching(SftpWildcardMatcher *swcm)

{
  sftp_request *req;
  sftp_packet *pktin;
  
  req = fxp_close_send(swcm->dirh);
  pktin = sftp_wait_for_reply(req);
  fxp_close_recv(pktin,req);
  if (swcm->names != (fxp_names *)0x0) {
    fxp_free_names(swcm->names);
  }
  safefree(swcm->prefix);
  safefree(swcm->wildcard);
  safefree(swcm);
  return;
}

Assistant:

void sftp_finish_wildcard_matching(SftpWildcardMatcher *swcm)
{
    struct sftp_packet *pktin;
    struct sftp_request *req;

    req = fxp_close_send(swcm->dirh);
    pktin = sftp_wait_for_reply(req);
    fxp_close_recv(pktin, req);

    if (swcm->names)
        fxp_free_names(swcm->names);

    sfree(swcm->prefix);
    sfree(swcm->wildcard);

    sfree(swcm);
}